

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<capnproto_test::capnp::test::TestInterface::Client>::fork
          (Promise<capnproto_test::capnp::test::TestInterface::Client> *this)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::_::PromiseNode> *in_RSI;
  Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>_> local_28;
  Promise<capnproto_test::capnp::test::TestInterface::Client> *this_local;
  
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>(in_RSI);
  refcounted<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_28,params);
  ForkedPromise<capnproto_test::capnp::test::TestInterface::Client>::ForkedPromise
            ((ForkedPromise<capnproto_test::capnp::test::TestInterface::Client> *)this,false,
             &local_28);
  Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>_>::~Own(&local_28);
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork() {
  return ForkedPromise<T>(false, refcounted<_::ForkHub<_::FixVoid<T>>>(kj::mv(node)));
}